

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void slang::ast::InstanceSymbol::fromSyntax
               (Compilation *comp,HierarchyInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,BindDirectiveInfo *bindInfo
               ,SyntaxNode *overrideSyntax)

{
  Token *this;
  SyntaxKind *pSVar1;
  group_type_pointer pgVar2;
  SymbolKind SVar3;
  group_type_pointer pgVar4;
  ConfigRule *configRule;
  uint uVar5;
  ushort uVar6;
  string_view sVar7;
  string_view sVar8;
  SyntaxNode *pSVar9;
  ASTContext *pAVar10;
  ResolvedConfig *pRVar11;
  HierarchyInstantiationSyntax *pHVar12;
  char *__s1;
  bool bVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  CheckerSymbol *checker;
  HierarchyOverrideNode *pHVar17;
  Scope *pSVar18;
  int *piVar19;
  uint64_t uVar20;
  ulong uVar21;
  SmallVectorBase<const_slang::ast::Symbol_*> *pSVar22;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar23;
  reference ppVar24;
  char_pointer puVar25;
  byte bVar26;
  Scope *pSVar27;
  SmallVectorBase<const_slang::ast::Symbol_*> *pSVar28;
  char_pointer puVar29;
  HierarchicalInstanceSyntax *pHVar30;
  iterator __begin4;
  Symbol *pSVar31;
  ConfigBlockSymbol *pCVar32;
  basic_string_view<char,_std::char_traits<char>_> *pbVar33;
  InstanceNameSyntax *pIVar34;
  bitmask<slang::ast::LookupFlags> flags;
  size_type __rlen;
  Compilation *this_00;
  BindDirectiveInfo *pBVar35;
  value_type_pointer ppVar36;
  table_element_pointer ppVar37;
  bitmask<slang::ast::InstanceFlags> flags_00;
  long lVar38;
  size_t sVar39;
  ulong uVar40;
  char_pointer puVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 uVar47;
  uchar uVar48;
  uchar uVar49;
  byte bVar50;
  uchar uVar51;
  byte bVar52;
  undefined1 uVar53;
  uchar uVar54;
  byte bVar55;
  uchar uVar56;
  uchar uVar57;
  byte bVar58;
  undefined1 uVar59;
  uchar uVar60;
  byte bVar61;
  uchar uVar62;
  byte bVar63;
  uchar uVar64;
  byte bVar65;
  undefined1 uVar66;
  uchar uVar67;
  byte bVar68;
  uchar uVar69;
  byte bVar70;
  uchar uVar71;
  byte bVar72;
  SourceRange sourceRange;
  string_view sVar73;
  iterator iVar74;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  string_view name;
  string_view name_00;
  string_view lookupName;
  string_view name_01;
  bool inChecker;
  TimeTraceScope timeScope;
  size_t pos;
  size_t pos_1;
  ResolvedConfig *resolvedConfig;
  string_view defName;
  Symbol *sym;
  DefinitionSymbol *owningDefinition;
  DefinitionLookupResult defResult;
  anon_class_72_9_2532bcb6 createInstances;
  DefinitionLookupResult defResult_2;
  SmallVector<const_slang::ast::Symbol_*,_5UL> parentStack;
  string_view rootName;
  InstanceBuilder builder;
  bool local_433;
  byte local_432;
  TimeTraceScope local_431;
  basic_string_view<char,_std::char_traits<char>_> *local_430;
  HierarchicalInstanceSyntax *local_428;
  InstanceNameSyntax *local_420;
  ASTContext *local_418;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_410;
  basic_string_view<char,_std::char_traits<char>_> *local_408;
  Token *local_400;
  undefined8 local_3f8;
  undefined1 uStack_3f0;
  byte bStack_3ef;
  byte bStack_3ee;
  byte bStack_3ed;
  undefined1 uStack_3ec;
  byte bStack_3eb;
  byte bStack_3ea;
  byte bStack_3e9;
  undefined8 local_3e8;
  uchar uStack_3e0;
  uchar uStack_3df;
  uchar uStack_3de;
  byte bStack_3dd;
  uchar uStack_3dc;
  uchar uStack_3db;
  uchar uStack_3da;
  byte bStack_3d9;
  ulong local_3d8;
  size_t local_3d0;
  Compilation *local_3c8;
  ResolvedConfig *local_3c0;
  string_view local_3b8;
  pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
  local_3a8;
  undefined8 local_388;
  uchar uStack_380;
  uchar uStack_37f;
  uchar uStack_37e;
  byte bStack_37d;
  uchar uStack_37c;
  uchar uStack_37b;
  uchar uStack_37a;
  byte bStack_379;
  HierarchyInstantiationSyntax *local_378;
  Compilation *local_370;
  InstanceNameSyntax *local_368;
  ConfigBlockSymbol *local_360;
  DefinitionSymbol *local_358;
  string_view local_350;
  DefinitionLookupResult local_340;
  Symbol local_328;
  group_type_pointer local_2e8;
  ConfigRule *local_2e0;
  InstanceBodySymbol *local_2d8;
  ulong local_2d0;
  SourceRange local_2c8;
  SourceRange local_2b8;
  SourceRange local_2a8;
  SourceRange local_298;
  anon_class_72_9_2532bcb6 local_288;
  DefinitionLookupResult local_240;
  undefined1 *local_228;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_220;
  undefined8 local_218;
  undefined1 local_210 [40];
  uchar local_1e8;
  uchar uStack_1e7;
  uchar uStack_1e6;
  byte bStack_1e5;
  uchar uStack_1e4;
  uchar uStack_1e3;
  uchar uStack_1e2;
  byte bStack_1e1;
  uchar uStack_1e0;
  uchar uStack_1df;
  uchar uStack_1de;
  byte bStack_1dd;
  uchar uStack_1dc;
  uchar uStack_1db;
  uchar uStack_1da;
  byte bStack_1d9;
  uchar local_1d8;
  uchar uStack_1d7;
  uchar uStack_1d6;
  byte bStack_1d5;
  uchar uStack_1d4;
  uchar uStack_1d3;
  uchar uStack_1d2;
  byte bStack_1d1;
  uchar uStack_1d0;
  uchar uStack_1cf;
  uchar uStack_1ce;
  byte bStack_1cd;
  uchar uStack_1cc;
  uchar uStack_1cb;
  uchar uStack_1ca;
  byte bStack_1c9;
  undefined1 local_1c8;
  byte bStack_1c7;
  byte bStack_1c6;
  byte bStack_1c5;
  undefined1 uStack_1c4;
  byte bStack_1c3;
  byte bStack_1c2;
  byte bStack_1c1;
  undefined1 uStack_1c0;
  byte bStack_1bf;
  byte bStack_1be;
  byte bStack_1bd;
  undefined1 uStack_1bc;
  byte bStack_1bb;
  byte bStack_1ba;
  byte bStack_1b9;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  undefined1 local_1a8 [144];
  undefined1 local_118 [32];
  undefined1 local_f8 [16];
  NetType *local_e8;
  size_t local_e0;
  ASTContext *local_d8;
  undefined1 local_d0 [16];
  HierarchyOverrideNode *local_c0;
  undefined1 local_b8 [16];
  SyntaxNode *local_a8;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 local_80 [40];
  basic_string_view<char,_std::char_traits<char>_> *local_58;
  size_t local_50;
  byte local_48;
  
  this = &syntax->type;
  local_410 = implicitNets;
  local_3e8 = results;
  local_3b8 = parsing::Token::valueText(this);
  flags.m_bits = (underlying_type)implicitNets;
  local_1a8._0_8_ = &local_3b8;
  if (TimeTrace::profiler != 0) {
    detail.callable = (intptr_t)local_1a8;
    detail.callback =
         function_ref<std::__cxx11::string()>::
         callback_fn<slang::ast::InstanceSymbol::fromSyntax(slang::ast::Compilation&,slang::syntax::HierarchyInstantiationSyntax_const&,slang::ast::ASTContext_const&,slang::SmallVectorBase<slang::ast::Symbol_const*>&,slang::SmallVectorBase<slang::ast::Symbol_const*>&,slang::ast::BindDirectiveInfo_const*,slang::syntax::SyntaxNode_const*)::__0>
    ;
    sVar73._M_str = "createInstances";
    sVar73._M_len = 0xf;
    TimeTrace::beginTrace(sVar73,detail);
  }
  local_433 = false;
  pSVar18 = (context->scope).ptr;
  bVar26 = 0;
  pSVar27 = pSVar18;
  do {
    pSVar31 = pSVar27->thisSym;
    SVar3 = pSVar31->kind;
    if (SVar3 == GenerateBlock) {
      bVar26 = bVar26 | *(byte *)((long)&pSVar31[1].originatingSyntax + 4);
    }
    else if (SVar3 == CheckerInstanceBody) {
      local_433 = true;
      bVar26 = bVar26 | *(byte *)((long)&pSVar31[2].name._M_str + 5) & 5;
      pSVar31 = (Symbol *)pSVar31[1].originatingSyntax;
    }
    else if (SVar3 == InstanceBody) {
      bVar26 = (byte)pSVar31[2].name._M_len & 5 | bVar26;
      goto LAB_0076a855;
    }
    pSVar27 = pSVar31->parentScope;
  } while (pSVar27 != (Scope *)0x0);
  pSVar31 = (Symbol *)0x0;
LAB_0076a855:
  if ((bVar26 & 1) != 0) {
    UninstantiatedDefSymbol::fromSyntax(comp,syntax,context,local_3e8,local_410);
    goto LAB_0076acf5;
  }
  flags_00.m_bits = bVar26 | 2;
  if (bindInfo == (BindDirectiveInfo *)0x0) {
    flags_00.m_bits = bVar26;
  }
  name._M_str = (char *)0x2;
  name._M_len = (size_t)local_3b8._M_str;
  local_3f8 = bindInfo;
  checker = (CheckerSymbol *)
            Lookup::unqualified((Lookup *)pSVar18,(Scope *)local_3b8._M_len,name,flags);
  if ((checker != (CheckerSymbol *)0x0) && ((checker->super_Symbol).kind == Checker)) {
    CheckerInstanceSymbol::fromSyntax(checker,syntax,context,local_3e8,local_410,flags_00);
    goto LAB_0076acf5;
  }
  pHVar17 = (HierarchyOverrideNode *)0x0;
  local_358 = (DefinitionSymbol *)0x0;
  local_3c0 = (ResolvedConfig *)0x0;
  local_418 = context;
  local_378 = syntax;
  if (pSVar31 != (Symbol *)0x0) {
    local_358 = (DefinitionSymbol *)pSVar31[2].name._M_str;
    if (*(long *)(pSVar31 + 2) == 0) {
      pHVar17 = (HierarchyOverrideNode *)0x0;
    }
    else {
      pHVar17 = anon_unknown.dwarf_1efa1d1::findParentOverrideNode((context->scope).ptr);
    }
    if (pSVar31[1].originatingSyntax != (SyntaxNode *)0x0) {
      local_3c0 = (ResolvedConfig *)pSVar31[1].originatingSyntax[3].previewNode;
    }
    if ((flags_00.m_bits & 2) != 0) {
      if ((flags_00.m_bits & 4) != 0) {
        sourceRange = parsing::Token::range(this);
        ASTContext::addDiag(context,(DiagCode)0xb0006,sourceRange);
        goto LAB_0076acf5;
      }
      flags_00.m_bits = flags_00.m_bits | 4;
    }
  }
  pHVar12 = local_378;
  pAVar10 = local_418;
  local_430 = (basic_string_view<char,_std::char_traits<char>_> *)
              (local_378->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  sVar39 = (local_378->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
  local_1a8._128_8_ = local_1a8;
  local_118._0_8_ = 0x3f;
  local_118._8_8_ = 1;
  local_118._16_16_ = ZEXT816(0x92b3d0);
  local_f8 = (undefined1  [16])0x0;
  local_400 = this;
  local_3c8 = comp;
  local_1a8._136_8_ = local_1a8._128_8_;
  local_e8 = Scope::getDefaultNetType((local_418->scope).ptr);
  sVar73 = local_3b8;
  pRVar11 = local_3c0;
  this_00 = local_3c8;
  local_98 = local_80;
  pHVar30 = (HierarchicalInstanceSyntax *)(pAVar10->scope).ptr;
  local_e0 = *(size_t *)&(pHVar30->super_SyntaxNode).kind;
  local_d8 = pAVar10;
  local_d0 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_a8 = overrideSyntax;
  local_a0 = local_410;
  local_90 = 0;
  local_88 = 10;
  local_58 = local_430;
  local_288.comp = local_3c8;
  local_288.syntax = pHVar12;
  local_288.context = pAVar10;
  local_288.results = local_3e8;
  local_288.implicitNets = local_410;
  local_288.builder = (InstanceBuilder *)local_1a8;
  local_288.owningDefinition = &local_358;
  local_288.inChecker = &local_433;
  local_288.resolvedConfig = &local_3c0;
  local_428 = pHVar30;
  local_c0 = pHVar17;
  local_50 = sVar39;
  local_48 = flags_00.m_bits;
  if (local_3f8 == (BindDirectiveInfo *)0x0) {
    sVar39 = local_3b8._M_len;
    pSVar28 = (SmallVectorBase<const_slang::ast::Symbol_*> *)local_3b8._M_str;
    if (local_3c0 != (ResolvedConfig *)0x0) {
      local_410 = (SmallVectorBase<const_slang::ast::Symbol_*> *)local_3b8._M_str;
      local_340.definition = &local_328;
      local_340.configRoot = (ConfigBlockSymbol *)0x0;
      local_340.configRule = (ConfigRule *)0x2;
      pCVar32 = local_3c0->useConfig;
      if (pCVar32->resolved == false) {
        ConfigBlockSymbol::resolve(pCVar32);
      }
      if ((pCVar32->instanceOverrides).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
          .size_ctrl.size != 0) {
        local_3d0 = sVar39;
        pSVar18 = (local_418->scope).ptr;
        local_228 = local_210;
        local_220 = (SmallVectorBase<const_slang::ast::Symbol_*> *)0x0;
        local_218 = 5;
        do {
          local_3a8.first.definition = pSVar18->thisSym;
          if ((((InstanceSymbolBase *)
               &((InstanceBodySymbol *)local_3a8.first.definition)->super_Symbol)->super_Symbol).
              kind == InstanceBody) {
            local_3a8.first.definition =
                 (Symbol *)((InstanceBodySymbol *)local_3a8.first.definition)->parentInstance;
          }
          SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                    ((SmallVectorBase<slang::ast::Symbol_const*> *)&local_228,(Symbol **)&local_3a8)
          ;
          pSVar18 = (((InstanceSymbolBase *)&(local_3a8.first.definition)->kind)->super_Symbol).
                    parentScope;
        } while ((pSVar18 != (Scope *)0x0) &&
                ((InstanceBodySymbol *)pRVar11->rootInstance !=
                 (InstanceBodySymbol *)local_3a8.first.definition));
        piVar19 = *(int **)(local_228 + (long)local_220 * 8 + -8);
        if (*piVar19 == 0x2f) {
          piVar19 = *(int **)(*(long *)(piVar19 + 0x14) + 0x90);
        }
        local_1b8._M_len = *(size_t *)(piVar19 + 2);
        local_1b8._M_str = *(char **)(piVar19 + 4);
        uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &pCVar32->instanceOverrides,&local_1b8);
        sVar39 = local_1b8._M_len;
        pbVar33 = (basic_string_view<char,_std::char_traits<char>_> *)
                  (uVar20 >>
                  ((byte)(pCVar32->instanceOverrides).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                         .arrays.groups_size_index & 0x3f));
        local_420 = (InstanceNameSyntax *)
                    (pCVar32->instanceOverrides).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    .arrays.groups_;
        lVar38 = (uVar20 & 0xff) * 4;
        uVar47 = (&UNK_0092f4ac)[lVar38];
        bVar26 = (&UNK_0092f4ad)[lVar38];
        bVar50 = (&UNK_0092f4ae)[lVar38];
        bVar52 = (&UNK_0092f4af)[lVar38];
        local_3e8 = (SmallVectorBase<const_slang::ast::Symbol_*> *)local_1b8._M_str;
        local_388 = (HierarchicalInstanceSyntax *)(ulong)((uint)uVar20 & 7);
        uVar40 = 0;
        uVar53 = uVar47;
        bVar55 = bVar26;
        bVar14 = bVar50;
        bVar58 = bVar52;
        uVar59 = uVar47;
        bVar61 = bVar26;
        bVar63 = bVar50;
        bVar65 = bVar52;
        uVar66 = uVar47;
        bVar68 = bVar26;
        bVar70 = bVar50;
        bVar72 = bVar52;
LAB_0076ae2b:
        pSVar1 = &(local_420->super_SyntaxNode).kind + (long)pbVar33 * 4;
        local_1c8 = (undefined1)*pSVar1;
        bStack_1c7 = *(byte *)((long)pSVar1 + 1);
        bStack_1c6 = *(byte *)((long)pSVar1 + 2);
        bStack_1c5 = *(byte *)((long)pSVar1 + 3);
        uStack_1c4 = *(undefined1 *)(pSVar1 + 1);
        bStack_1c3 = *(byte *)((long)pSVar1 + 5);
        bStack_1c2 = *(byte *)((long)pSVar1 + 6);
        bStack_1c1 = *(byte *)((long)pSVar1 + 7);
        uStack_1c0 = *(undefined1 *)(pSVar1 + 2);
        bStack_1bf = *(byte *)((long)pSVar1 + 9);
        bStack_1be = *(byte *)((long)pSVar1 + 10);
        bStack_1bd = *(byte *)((long)pSVar1 + 0xb);
        uStack_1bc = *(undefined1 *)(pSVar1 + 3);
        bStack_1bb = *(byte *)((long)pSVar1 + 0xd);
        bStack_1ba = *(byte *)((long)pSVar1 + 0xe);
        bStack_1b9 = *(byte *)((long)pSVar1 + 0xf);
        auVar42[0] = -(local_1c8 == uVar47);
        auVar42[1] = -(bStack_1c7 == bVar26);
        auVar42[2] = -(bStack_1c6 == bVar50);
        auVar42[3] = -(bStack_1c5 == bVar52);
        auVar42[4] = -(uStack_1c4 == uVar53);
        auVar42[5] = -(bStack_1c3 == bVar55);
        auVar42[6] = -(bStack_1c2 == bVar14);
        auVar42[7] = -(bStack_1c1 == bVar58);
        auVar42[8] = -(uStack_1c0 == uVar59);
        auVar42[9] = -(bStack_1bf == bVar61);
        auVar42[10] = -(bStack_1be == bVar63);
        auVar42[0xb] = -(bStack_1bd == bVar65);
        auVar42[0xc] = -(uStack_1bc == uVar66);
        auVar42[0xd] = -(bStack_1bb == bVar68);
        auVar42[0xe] = -(bStack_1ba == bVar70);
        auVar42[0xf] = -(bStack_1b9 == bVar72);
        local_428 = (HierarchicalInstanceSyntax *)CONCAT71(local_428._1_7_,bStack_1b9);
        uVar16 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
        local_430 = pbVar33;
        if (uVar16 == 0) {
LAB_0076aebc:
          sVar7._M_str = local_350._M_str;
          sVar7._M_len = local_350._M_len;
          if (((char)local_388[0x13989].closeParen.kind & local_428._0_1_) != Unknown)
          goto code_r0x0076aeec;
        }
        else {
          ppVar36 = (pCVar32->instanceOverrides).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    .arrays.elements_;
          local_3f8 = (BindDirectiveInfo *)
                      CONCAT17(bVar58,CONCAT16(bVar14,CONCAT15(bVar55,CONCAT14(uVar53,CONCAT13(
                                                  bVar52,CONCAT12(bVar50,CONCAT11(bVar26,uVar47)))))
                                              ));
          uStack_3f0 = uVar59;
          bStack_3ef = bVar61;
          bStack_3ee = bVar63;
          bStack_3ed = bVar65;
          uStack_3ec = uVar66;
          bStack_3eb = bVar68;
          bStack_3ea = bVar70;
          bStack_3e9 = bVar72;
          while( true ) {
            uVar5 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            uVar21 = (ulong)uVar5;
            if ((sVar39 == ppVar36[(long)pbVar33 * 0xf + uVar21].first._M_len) &&
               ((sVar39 == 0 ||
                (iVar15 = bcmp(local_3e8,ppVar36[(long)pbVar33 * 0xf + uVar21].first._M_str,sVar39),
                iVar15 == 0)))) break;
            uVar16 = uVar16 - 1 & uVar16;
            uVar47 = (undefined1)local_3f8;
            bVar26 = local_3f8._1_1_;
            bVar50 = local_3f8._2_1_;
            bVar52 = local_3f8._3_1_;
            uVar53 = local_3f8._4_1_;
            bVar55 = local_3f8._5_1_;
            bVar14 = local_3f8._6_1_;
            bVar58 = local_3f8._7_1_;
            uVar59 = uStack_3f0;
            bVar61 = bStack_3ef;
            bVar63 = bStack_3ee;
            bVar65 = bStack_3ed;
            uVar66 = uStack_3ec;
            bVar68 = bStack_3eb;
            bVar70 = bStack_3ea;
            bVar72 = bStack_3e9;
            if (uVar16 == 0) goto LAB_0076aebc;
          }
          pHVar30 = (HierarchicalInstanceSyntax *)(ppVar36 + (long)pbVar33 * 0xf + uVar21);
          pBVar35 = (BindDirectiveInfo *)&(pHVar30->super_SyntaxNode).previewNode;
          pSVar22 = (SmallVectorBase<const_slang::ast::Symbol_*> *)(local_220[-1].firstElement + 7);
          pSVar28 = local_220;
          if (pSVar22 != (SmallVectorBase<const_slang::ast::Symbol_*> *)0x0) goto LAB_0076af31;
LAB_0076b090:
          if ((*(size_t *)&(pHVar30->connections).super_SyntaxListBase.super_SyntaxNode != 0) &&
             (uVar40 = (local_378->instances).elements._M_extent._M_extent_value + 1, 1 < uVar40)) {
            local_370 = ((local_418->scope).ptr)->compilation;
            local_408 = (basic_string_view<char,_std::char_traits<char>_> *)(uVar40 >> 1);
            pbVar33 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
            local_420 = (InstanceNameSyntax *)0x0;
            local_3f8 = pBVar35;
            local_388 = pHVar30;
            do {
              pHVar30 = local_388;
              pBVar35 = local_3f8;
              ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)((local_378->instances).elements._M_ptr + (long)pbVar33 * 2))
              ;
              local_428 = (HierarchicalInstanceSyntax *)*ppSVar23;
              if (local_428->decl == (InstanceNameSyntax *)0x0) {
                sVar73 = (string_view)(ZEXT816(0x9db414) << 0x40);
              }
              else {
                sVar73 = parsing::Token::valueText(&local_428->decl->name);
              }
              local_430 = pbVar33;
              local_350 = sVar73;
              uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)pBVar35,&local_350);
              __s1 = local_350._M_str;
              sVar39 = local_350._M_len;
              uVar40 = uVar20 >> (*(byte *)&pBVar35->bindSyntax & 0x3f);
              local_2e8 = *(group_type_pointer *)&pHVar30->openParen;
              lVar38 = (uVar20 & 0xff) * 4;
              uVar48 = (&UNK_0092f4ac)[lVar38];
              uVar49 = (&UNK_0092f4ad)[lVar38];
              uVar51 = (&UNK_0092f4ae)[lVar38];
              bVar26 = (&UNK_0092f4af)[lVar38];
              local_2d0 = (ulong)((uint)uVar20 & 7);
              local_368 = (InstanceNameSyntax *)0x0;
              uVar54 = uVar48;
              uVar56 = uVar49;
              uVar57 = uVar51;
              bVar50 = bVar26;
              uVar60 = uVar48;
              uVar62 = uVar49;
              uVar64 = uVar51;
              bVar52 = bVar26;
              uVar67 = uVar48;
              uVar69 = uVar49;
              uVar71 = uVar51;
              bVar55 = bVar26;
              do {
                pgVar2 = local_2e8 + uVar40;
                local_1e8 = pgVar2->m[0].n;
                uStack_1e7 = pgVar2->m[1].n;
                uStack_1e6 = pgVar2->m[2].n;
                bStack_1e5 = pgVar2->m[3].n;
                uStack_1e4 = pgVar2->m[4].n;
                uStack_1e3 = pgVar2->m[5].n;
                uStack_1e2 = pgVar2->m[6].n;
                bStack_1e1 = pgVar2->m[7].n;
                uStack_1e0 = pgVar2->m[8].n;
                uStack_1df = pgVar2->m[9].n;
                uStack_1de = pgVar2->m[10].n;
                bStack_1dd = pgVar2->m[0xb].n;
                uStack_1dc = pgVar2->m[0xc].n;
                uStack_1db = pgVar2->m[0xd].n;
                uStack_1da = pgVar2->m[0xe].n;
                local_432 = pgVar2->m[0xf].n;
                auVar44[0] = -(local_1e8 == uVar48);
                auVar44[1] = -(uStack_1e7 == uVar49);
                auVar44[2] = -(uStack_1e6 == uVar51);
                auVar44[3] = -(bStack_1e5 == bVar26);
                auVar44[4] = -(uStack_1e4 == uVar54);
                auVar44[5] = -(uStack_1e3 == uVar56);
                auVar44[6] = -(uStack_1e2 == uVar57);
                auVar44[7] = -(bStack_1e1 == bVar50);
                auVar44[8] = -(uStack_1e0 == uVar60);
                auVar44[9] = -(uStack_1df == uVar62);
                auVar44[10] = -(uStack_1de == uVar64);
                auVar44[0xb] = -(bStack_1dd == bVar52);
                auVar44[0xc] = -(uStack_1dc == uVar67);
                auVar44[0xd] = -(uStack_1db == uVar69);
                auVar44[0xe] = -(uStack_1da == uVar71);
                auVar44[0xf] = -(local_432 == bVar55);
                uVar16 = (uint)(ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe);
                local_3d8 = uVar40;
                bStack_1d9 = local_432;
                if (uVar16 != 0) {
                  ppVar36 = (value_type_pointer)(local_388->openParen).info;
                  local_3e8 = (SmallVectorBase<const_slang::ast::Symbol_*> *)
                              CONCAT17(bVar50,CONCAT16(uVar57,CONCAT15(uVar56,CONCAT14(uVar54,
                                                  CONCAT13(bVar26,CONCAT12(uVar51,CONCAT11(uVar49,
                                                  uVar48)))))));
                  uStack_3e0 = uVar60;
                  uStack_3df = uVar62;
                  uStack_3de = uVar64;
                  bStack_3dd = bVar52;
                  uStack_3dc = uVar67;
                  uStack_3db = uVar69;
                  uStack_3da = uVar71;
                  bStack_3d9 = bVar55;
                  do {
                    uVar5 = 0;
                    if (uVar16 != 0) {
                      for (; (uVar16 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                      }
                    }
                    uVar21 = (ulong)uVar5;
                    if (sVar39 == ppVar36[uVar40 * 0xf + uVar21].first._M_len) {
                      if (sVar39 != 0) {
                        iVar15 = bcmp(__s1,ppVar36[uVar40 * 0xf + uVar21].first._M_str,sVar39);
                        if (iVar15 != 0) goto LAB_0076b265;
                      }
                      pHVar30 = local_428;
                      ppVar36 = ppVar36 + uVar40 * 0xf + uVar21;
                      configRule = (ppVar36->second).rule;
                      if (configRule == (ConfigRule *)0x0) {
                        bVar13 = true;
                        goto LAB_0076b3ba;
                      }
                      pSVar18 = (local_418->scope).ptr;
                      local_298 = slang::syntax::SyntaxNode::sourceRange
                                            (&local_428->super_SyntaxNode);
                      lookupName._M_str = (char *)local_410;
                      lookupName._M_len = local_3d0;
                      Compilation::getDefinition
                                (&local_240,local_370,lookupName,pSVar18,configRule,local_298,
                                 (DiagCode)0xcf0006);
                      local_3a8.first.configRule = local_240.configRule;
                      local_3a8.first.definition = local_240.definition;
                      local_3a8.first.configRoot = local_240.configRoot;
                      local_3a8.second = pHVar30;
                      SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                      ::
                      emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                                ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                                  *)&local_340,&local_3a8);
                      pCVar32 = local_240.configRoot;
                      if (local_240.configRoot == (ConfigBlockSymbol *)0x0) goto LAB_0076b5af;
                      goto LAB_0076b4cc;
                    }
LAB_0076b265:
                    uVar16 = uVar16 - 1 & uVar16;
                    uVar48 = (uchar)local_3e8;
                    uVar49 = local_3e8._1_1_;
                    uVar51 = local_3e8._2_1_;
                    bVar26 = local_3e8._3_1_;
                    uVar54 = local_3e8._4_1_;
                    uVar56 = local_3e8._5_1_;
                    uVar57 = local_3e8._6_1_;
                    bVar50 = local_3e8._7_1_;
                    uVar60 = uStack_3e0;
                    uVar62 = uStack_3df;
                    uVar64 = uStack_3de;
                    bVar52 = bStack_3dd;
                    uVar67 = uStack_3dc;
                    uVar69 = uStack_3db;
                    uVar71 = uStack_3da;
                    bVar55 = bStack_3d9;
                  } while (uVar16 != 0);
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[local_2d0] & local_432) == 0) break;
                pSVar9 = &local_368->super_SyntaxNode;
                local_368 = (InstanceNameSyntax *)((long)&(local_368->super_SyntaxNode).kind + 1);
                uVar40 = (long)&pSVar9->kind + local_3d8 + 1 & (ulong)local_388->decl;
              } while (local_368 <= local_388->decl);
              bVar13 = false;
              ppVar36 = (value_type_pointer)0x0;
LAB_0076b3ba:
              sVar39 = local_3d0;
              pCVar32 = local_360;
              if (((ulong)local_420 & 1) == 0) {
                pSVar18 = (local_418->scope).ptr;
                local_2a8 = parsing::Token::range(local_400);
                name_01._M_str = (char *)local_410;
                name_01._M_len = sVar39;
                Compilation::getDefinition
                          (&local_3a8.first,local_370,name_01,pSVar18,local_2a8,(DiagCode)0xcf0006);
                local_2d8 = (InstanceBodySymbol *)local_3a8.first.definition;
                local_2e0 = local_3a8.first.configRule;
                pCVar32 = local_3a8.first.configRoot;
              }
              local_3a8.first.definition = &local_2d8->super_Symbol;
              local_3a8.first.configRule = local_2e0;
              local_3a8.second = local_428;
              local_3a8.first.configRoot = pCVar32;
              ppVar24 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                        ::
                        emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                                  ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                                    *)&local_340,&local_3a8);
              local_420 = (InstanceNameSyntax *)CONCAT71((int7)((ulong)ppVar24 >> 8),1);
              if (pCVar32 == (ConfigBlockSymbol *)0x0) {
                local_360 = (ConfigBlockSymbol *)0x0;
              }
              else {
                local_360 = pCVar32;
                if (bVar13) {
LAB_0076b4cc:
                  iVar74 = boost::unordered::detail::foa::
                           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                           ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                    *)&ppVar36->second);
                  if (iVar74.p_ != (table_element_pointer)0x0) {
LAB_0076b4e7:
                    do {
                      anon_unknown.dwarf_1efa1d1::checkForInvalidNestedConfigNodes
                                (local_418,&(iVar74.p_)->second,pCVar32);
                      puVar29 = iVar74.pc_ + 0x12;
                      puVar41 = iVar74.pc_ + 2;
LAB_0076b508:
                      puVar25 = puVar41;
                      puVar41 = iVar74.pc_;
                      ppVar37 = iVar74.p_ + 1;
                      if (((uint)iVar74.pc_ & 0xf) != 0xe) goto code_r0x0076b517;
                      auVar45[0] = -(*puVar25 == '\0');
                      auVar45[1] = -(puVar25[1] == '\0');
                      auVar45[2] = -(puVar25[2] == '\0');
                      auVar45[3] = -(puVar25[3] == '\0');
                      auVar45[4] = -(puVar25[4] == '\0');
                      auVar45[5] = -(puVar25[5] == '\0');
                      auVar45[6] = -(puVar25[6] == '\0');
                      auVar45[7] = -(puVar25[7] == '\0');
                      auVar45[8] = -(puVar25[8] == '\0');
                      auVar45[9] = -(puVar25[9] == '\0');
                      auVar45[10] = -(puVar25[10] == '\0');
                      auVar45[0xb] = -(puVar25[0xb] == '\0');
                      auVar45[0xc] = -(puVar25[0xc] == '\0');
                      auVar45[0xd] = -(puVar25[0xd] == '\0');
                      auVar45[0xe] = -(puVar25[0xe] == '\0');
                      auVar45[0xf] = -(puVar25[0xf] == '\0');
                      uVar6 = (ushort)(SUB161(auVar45 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe;
                      while (uVar6 == 0x7fff) {
                        ppVar37 = ppVar37 + 0xf;
                        auVar46[0] = -(*puVar29 == '\0');
                        auVar46[1] = -(puVar29[1] == '\0');
                        auVar46[2] = -(puVar29[2] == '\0');
                        auVar46[3] = -(puVar29[3] == '\0');
                        auVar46[4] = -(puVar29[4] == '\0');
                        auVar46[5] = -(puVar29[5] == '\0');
                        auVar46[6] = -(puVar29[6] == '\0');
                        auVar46[7] = -(puVar29[7] == '\0');
                        auVar46[8] = -(puVar29[8] == '\0');
                        auVar46[9] = -(puVar29[9] == '\0');
                        auVar46[10] = -(puVar29[10] == '\0');
                        auVar46[0xb] = -(puVar29[0xb] == '\0');
                        auVar46[0xc] = -(puVar29[0xc] == '\0');
                        auVar46[0xd] = -(puVar29[0xd] == '\0');
                        auVar46[0xe] = -(puVar29[0xe] == '\0');
                        auVar46[0xf] = -(puVar29[0xf] == '\0');
                        puVar25 = puVar29;
                        puVar29 = puVar29 + 0x10;
                        uVar6 = (ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe;
                      }
                      uVar16 = 0;
                      if ((uVar6 ^ 0x7fff) != 0) {
                        for (; ((uVar6 ^ 0x7fff) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                        }
                      }
                      if (puVar25[uVar16] == '\x01') break;
                      iVar74.p_ = ppVar37 + uVar16;
                      iVar74.pc_ = puVar25 + uVar16;
                    } while( true );
                  }
                }
              }
LAB_0076b5af:
              pbVar33 = (basic_string_view<char,_std::char_traits<char>_> *)
                        ((long)&local_430->_M_len + 1);
            } while (pbVar33 != local_408);
          }
        }
        goto LAB_0076b0af;
      }
      goto LAB_0076abaf;
    }
    goto LAB_0076ac70;
  }
  local_2b8 = parsing::Token::range(local_400);
  Compilation::getDefinition(&local_340,this_00,sVar73,(Scope *)local_428,local_2b8,local_3f8);
  pBVar35 = local_3f8;
  if ((local_340.configRoot != (ConfigBlockSymbol *)0x0) &&
     (local_3c0 = BumpAllocator::
                  emplace<slang::ast::ResolvedConfig,slang::ast::ConfigBlockSymbol_const&,slang::ast::InstanceSymbol_const&>
                            (&this_00->super_BumpAllocator,local_340.configRoot,
                             (InstanceSymbol *)pSVar31[1].originatingSyntax),
     pBVar35->isNewConfigRoot == false)) {
    local_340.configRoot = (ConfigBlockSymbol *)0x0;
    sVar39 = (pBVar35->liblist)._M_extent._M_extent_value;
    (local_3c0->liblist)._M_ptr = (pBVar35->liblist)._M_ptr;
    (local_3c0->liblist)._M_extent._M_extent_value = sVar39;
  }
  fromSyntax::anon_class_72_9_2532bcb6::operator()
            (&local_288,&local_340,(HierarchicalInstanceSyntax *)0x0);
  goto LAB_0076acce;
code_r0x0076b517:
  iVar74.p_ = ppVar37;
  iVar74.pc_ = puVar41 + 1;
  puVar29 = puVar29 + 1;
  puVar41 = puVar25 + 1;
  if (puVar25[-1] != '\0') goto code_r0x0076b528;
  goto LAB_0076b508;
code_r0x0076b528:
  if (puVar25[-1] == '\x01') goto LAB_0076b5af;
  iVar74.pc_ = puVar25 + -1;
  goto LAB_0076b4e7;
code_r0x0076aeec:
  uVar21 = (pCVar32->instanceOverrides).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
           .arrays.groups_size_mask;
  lVar38 = uVar40 + 1;
  uVar40 = uVar40 + 1;
  pbVar33 = (basic_string_view<char,_std::char_traits<char>_> *)
            ((long)&local_430->_M_len + lVar38 & uVar21);
  local_350 = sVar7;
  if (uVar21 < uVar40) goto LAB_0076b0af;
  goto LAB_0076ae2b;
LAB_0076af31:
  pbVar33 = (basic_string_view<char,_std::char_traits<char>_> *)
            (*(long *)(local_228 + (long)pSVar28 * 8 + -0x10) + 8);
  local_3e8 = pSVar22;
  uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)pBVar35,
                      pbVar33);
  uVar40 = uVar20 >> ((byte)(((InstanceOverride *)&(pHVar30->super_SyntaxNode).previewNode)->
                            childNodes).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar38 = (uVar20 & 0xff) * 4;
  uVar48 = (&UNK_0092f4ac)[lVar38];
  uVar49 = (&UNK_0092f4ad)[lVar38];
  uVar51 = (&UNK_0092f4ae)[lVar38];
  bVar26 = (&UNK_0092f4af)[lVar38];
  pIVar34 = (InstanceNameSyntax *)0x0;
  uVar54 = uVar48;
  uVar56 = uVar49;
  uVar57 = uVar51;
  bVar50 = bVar26;
  uVar60 = uVar48;
  uVar62 = uVar49;
  uVar64 = uVar51;
  bVar52 = bVar26;
  uVar67 = uVar48;
  uVar69 = uVar49;
  uVar71 = uVar51;
  bVar55 = bVar26;
  local_3f8 = pBVar35;
  do {
    pgVar4 = *(group_type_pointer *)&pHVar30->openParen;
    pgVar2 = pgVar4 + uVar40;
    local_1d8 = pgVar2->m[0].n;
    uStack_1d7 = pgVar2->m[1].n;
    uStack_1d6 = pgVar2->m[2].n;
    bStack_1d5 = pgVar2->m[3].n;
    uStack_1d4 = pgVar2->m[4].n;
    uStack_1d3 = pgVar2->m[5].n;
    uStack_1d2 = pgVar2->m[6].n;
    bStack_1d1 = pgVar2->m[7].n;
    uStack_1d0 = pgVar2->m[8].n;
    uStack_1cf = pgVar2->m[9].n;
    uStack_1ce = pgVar2->m[10].n;
    bStack_1cd = pgVar2->m[0xb].n;
    uStack_1cc = pgVar2->m[0xc].n;
    uStack_1cb = pgVar2->m[0xd].n;
    uStack_1ca = pgVar2->m[0xe].n;
    bVar14 = pgVar2->m[0xf].n;
    auVar43[0] = -(local_1d8 == uVar48);
    auVar43[1] = -(uStack_1d7 == uVar49);
    auVar43[2] = -(uStack_1d6 == uVar51);
    auVar43[3] = -(bStack_1d5 == bVar26);
    auVar43[4] = -(uStack_1d4 == uVar54);
    auVar43[5] = -(uStack_1d3 == uVar56);
    auVar43[6] = -(uStack_1d2 == uVar57);
    auVar43[7] = -(bStack_1d1 == bVar50);
    auVar43[8] = -(uStack_1d0 == uVar60);
    auVar43[9] = -(uStack_1cf == uVar62);
    auVar43[10] = -(uStack_1ce == uVar64);
    auVar43[0xb] = -(bStack_1cd == bVar52);
    auVar43[0xc] = -(uStack_1cc == uVar67);
    auVar43[0xd] = -(uStack_1cb == uVar69);
    auVar43[0xe] = -(uStack_1ca == uVar71);
    auVar43[0xf] = -(bVar14 == bVar55);
    uVar16 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe);
    bStack_1c9 = bVar14;
    if (uVar16 != 0) {
      local_388 = (HierarchicalInstanceSyntax *)
                  CONCAT17(bVar50,CONCAT16(uVar57,CONCAT15(uVar56,CONCAT14(uVar54,CONCAT13(bVar26,
                                                  CONCAT12(uVar51,CONCAT11(uVar49,uVar48)))))));
      ppVar36 = (value_type_pointer)(pHVar30->openParen).info;
      local_430 = pbVar33;
      local_428 = pHVar30;
      local_420 = pIVar34;
      local_3d8 = uVar40;
      uStack_380 = uVar60;
      uStack_37f = uVar62;
      uStack_37e = uVar64;
      bStack_37d = bVar52;
      uStack_37c = uVar67;
      uStack_37b = uVar69;
      uStack_37a = uVar71;
      bStack_379 = bVar55;
      do {
        uVar5 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        pHVar30 = (HierarchicalInstanceSyntax *)(ppVar36 + uVar40 * 0xf + (ulong)uVar5);
        bVar13 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_3f8,local_430,
                            (basic_string_view<char,_std::char_traits<char>_> *)pHVar30);
        if (bVar13) {
          pBVar35 = (BindDirectiveInfo *)&(pHVar30->super_SyntaxNode).previewNode;
          pSVar22 = (SmallVectorBase<const_slang::ast::Symbol_*> *)(local_3e8[-1].firstElement + 7);
          pSVar28 = local_3e8;
          if (pSVar22 == (SmallVectorBase<const_slang::ast::Symbol_*> *)0x0) goto LAB_0076b090;
          goto LAB_0076af31;
        }
        uVar16 = uVar16 - 1 & uVar16;
      } while (uVar16 != 0);
      bVar14 = pgVar4[uVar40].m[0xf].n;
      pHVar30 = local_428;
      pbVar33 = local_430;
      pIVar34 = local_420;
      uVar40 = local_3d8;
      uVar48 = (uchar)local_388;
      uVar49 = local_388._1_1_;
      uVar51 = local_388._2_1_;
      bVar26 = local_388._3_1_;
      uVar54 = local_388._4_1_;
      uVar56 = local_388._5_1_;
      uVar57 = local_388._6_1_;
      bVar50 = local_388._7_1_;
      uVar60 = uStack_380;
      uVar62 = uStack_37f;
      uVar64 = uStack_37e;
      bVar52 = bStack_37d;
      uVar67 = uStack_37c;
      uVar69 = uStack_37b;
      uVar71 = uStack_37a;
      bVar55 = bStack_379;
    }
    sVar8._M_str = local_350._M_str;
    sVar8._M_len = local_350._M_len;
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bVar14) == 0) break;
    pSVar9 = &pIVar34->super_SyntaxNode;
    pIVar34 = (InstanceNameSyntax *)((long)&(pIVar34->super_SyntaxNode).kind + 1);
    uVar40 = (ulong)((long)&pSVar9->kind + uVar40 + 1) & (ulong)pHVar30->decl;
    local_350 = sVar8;
  } while (pIVar34 <= pHVar30->decl);
LAB_0076b0af:
  this_00 = local_3c8;
  if (local_228 != local_210) {
    operator_delete(local_228);
    this_00 = local_3c8;
  }
LAB_0076abaf:
  if (local_340.configRoot == (ConfigBlockSymbol *)0x0) {
    if (local_340.definition != &local_328) {
      operator_delete(local_340.definition);
    }
    pHVar30 = (HierarchicalInstanceSyntax *)(local_418->scope).ptr;
    pSVar28 = (SmallVectorBase<const_slang::ast::Symbol_*> *)local_3b8._M_str;
    sVar39 = local_3b8._M_len;
LAB_0076ac70:
    local_2c8 = parsing::Token::range(local_400);
    name_00._M_str = (char *)pSVar28;
    name_00._M_len = sVar39;
    Compilation::getDefinition
              (&local_340,this_00,name_00,(Scope *)pHVar30,local_2c8,(DiagCode)0xcf0006);
    fromSyntax::anon_class_72_9_2532bcb6::operator()
              (&local_288,&local_340,(HierarchicalInstanceSyntax *)0x0);
  }
  else {
    lVar38 = (long)local_340.configRoot << 5;
    pSVar31 = local_340.definition;
    do {
      fromSyntax::anon_class_72_9_2532bcb6::operator()
                (&local_288,(DefinitionLookupResult *)pSVar31,
                 *(HierarchicalInstanceSyntax **)&(pSVar31->location).field_0x0);
      pSVar31 = (Symbol *)&pSVar31->parentScope;
      lVar38 = lVar38 + -0x20;
    } while (lVar38 != 0);
    if (local_340.definition != &local_328) {
      operator_delete(local_340.definition);
    }
  }
LAB_0076acce:
  if (local_98 != local_80) {
    operator_delete(local_98);
  }
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_((allocator_type)local_1a8._136_8_,
            (table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
             *)local_118);
LAB_0076acf5:
  TimeTraceScope::~TimeTraceScope(&local_431);
  return;
}

Assistant:

void InstanceSymbol::fromSyntax(Compilation& comp, const HierarchyInstantiationSyntax& syntax,
                                const ASTContext& context, SmallVectorBase<const Symbol*>& results,
                                SmallVectorBase<const Symbol*>& implicitNets,
                                const BindDirectiveInfo* bindInfo,
                                const SyntaxNode* overrideSyntax) {
    auto defName = syntax.type.valueText();
    TimeTraceScope timeScope("createInstances"sv, [&] { return std::string(defName); });

    // Find our parent instance, if there is one.
    bitmask<InstanceFlags> flags;
    bool inChecker = false;
    const InstanceBodySymbol* parentInst = nullptr;
    const Scope* currScope = context.scope;
    do {
        auto& sym = currScope->asSymbol();
        if (sym.kind == SymbolKind::InstanceBody) {
            parentInst = &sym.as<InstanceBodySymbol>();
            flags |= parentInst->flags & ~InstanceFlags::FromBind;
            break;
        }

        if (sym.kind == SymbolKind::CheckerInstanceBody) {
            auto& body = sym.as<CheckerInstanceBodySymbol>();
            inChecker = true;
            flags |= body.flags & ~InstanceFlags::FromBind;
            currScope = body.parentInstance->getParentScope();
            continue;
        }

        if (sym.kind == SymbolKind::GenerateBlock) {
            if (sym.as<GenerateBlockSymbol>().isUninstantiated)
                flags |= InstanceFlags::Uninstantiated;
        }
        currScope = sym.getParentScope();
    } while (currScope);

    // If this instance is not instantiated then we'll just fill in a placeholder
    // and move on. This is likely inside an untaken generate branch.
    if (flags.has(InstanceFlags::Uninstantiated)) {
        UninstantiatedDefSymbol::fromSyntax(comp, syntax, context, results, implicitNets);
        return;
    }

    if (bindInfo)
        flags |= InstanceFlags::FromBind;

    // Unfortunately this instantiation could be for a checker instead of a
    // module/interface/program, so we're forced to do a real name lookup here
    // in the local scope before doing a global definition lookup.
    if (auto sym = Lookup::unqualified(*context.scope, defName, LookupFlags::AllowDeclaredAfter)) {
        if (sym->kind == SymbolKind::Checker) {
            CheckerInstanceSymbol::fromSyntax(sym->as<CheckerSymbol>(), syntax, context, results,
                                              implicitNets, flags);
            return;
        }
    }

    const DefinitionSymbol* owningDefinition = nullptr;
    const HierarchyOverrideNode* parentOverrideNode = nullptr;
    const ResolvedConfig* resolvedConfig = nullptr;
    if (parentInst) {
        owningDefinition = &parentInst->getDefinition();

        // In the uncommon case that our parent instance has an override
        // node set, we need to go back and make sure we account for any
        // generate blocks that might actually be along the parent path for
        // the new instances we're creating.
        if (parentInst->hierarchyOverrideNode)
            parentOverrideNode = findParentOverrideNode(*context.scope);

        // Check if our parent has a configuration applied. If so, and if
        // that configuration has instance overrides, we need to check if
        // any of them apply to the instances we're about to create.
        if (parentInst->parentInstance)
            resolvedConfig = parentInst->parentInstance->resolvedConfig;

        if (flags.has(InstanceFlags::FromBind)) {
            if (flags.has(InstanceFlags::ParentFromBind)) {
                context.addDiag(diag::BindUnderBind, syntax.type.range());
                return;
            }

            // If our parent is from a bind statement, pass down the flag
            // so that we prevent further binds below us too.
            flags |= InstanceFlags::ParentFromBind;
        }
    }

    InstanceBuilder builder(context, implicitNets, parentOverrideNode, syntax.attributes, flags,
                            overrideSyntax);

    // Creates instance symbols -- if specificInstance is provided then only that
    // instance will be created, otherwise all instances in the original syntax
    // node will be created in one go.
    auto createInstances = [&](const Compilation::DefinitionLookupResult& defResult,
                               const HierarchicalInstanceSyntax* specificInstance) {
        auto def = defResult.definition;
        if (!def) {
            UninstantiatedDefSymbol::fromSyntax(comp, syntax, specificInstance, context, results,
                                                implicitNets, builder.implicitNetNames,
                                                builder.netType);
            return;
        }

        auto confRule = defResult.configRule;
        auto addDiag = [&](DiagCode code) -> Diagnostic& {
            if (confRule) {
                SLANG_ASSERT(specificInstance);
                auto& diag = context.addDiag(code, specificInstance->sourceRange());
                diag.addNote(diag::NoteConfigRule, confRule->syntax->sourceRange());
                return diag;
            }
            else {
                auto& diag = context.addDiag(code, syntax.type.range());
                if (specificInstance)
                    diag << specificInstance->sourceRange();
                return diag;
            }
        };

        if (def->kind == SymbolKind::Primitive) {
            PrimitiveInstanceSymbol::fromSyntax(def->as<PrimitiveSymbol>(), syntax,
                                                specificInstance, context, results, implicitNets,
                                                builder.implicitNetNames);
            if (!results.empty()) {
                if (!owningDefinition ||
                    owningDefinition->definitionKind != DefinitionKind::Module || inChecker) {
                    addDiag(diag::InvalidPrimInstanceForParent);
                }
                else if (confRule && confRule->paramOverrides) {
                    addDiag(diag::ConfigParamsForPrimitive);
                }
            }
            return;
        }

        auto& definition = def->as<DefinitionSymbol>();
        definition.noteInstantiated();

        if (inChecker) {
            addDiag(diag::InvalidInstanceForParent)
                << definition.getArticleKindString() << "a checker"sv;
        }
        else if (owningDefinition) {
            auto owningKind = owningDefinition->definitionKind;
            if (owningKind == DefinitionKind::Program ||
                (owningKind == DefinitionKind::Interface &&
                 definition.definitionKind == DefinitionKind::Module)) {
                addDiag(diag::InvalidInstanceForParent) << definition.getArticleKindString()
                                                        << owningDefinition->getArticleKindString();
            }
        }

        ParameterBuilder paramBuilder(*context.scope, definition.name, definition.parameters);
        if (syntax.parameters)
            paramBuilder.setAssignments(*syntax.parameters, /* isFromConfig */ false);

        auto localConfig = resolvedConfig;
        if (confRule) {
            SLANG_ASSERT(resolvedConfig);
            auto rc = comp.emplace<ResolvedConfig>(*resolvedConfig);
            rc->configRule = confRule;

            confRule->isUsed = true;
            if (confRule->liblist)
                rc->liblist = *confRule->liblist;
            localConfig = rc;

            if (confRule->paramOverrides) {
                paramBuilder.setConfigScope(rc->useConfig);
                paramBuilder.setAssignments(*confRule->paramOverrides, /* isFromConfig */ true);
            }
        }

        builder.reset(definition, paramBuilder, localConfig, defResult.configRoot);

        if (specificInstance) {
            results.push_back(builder.create(*specificInstance));
        }
        else {
            // NOLINTNEXTLINE
            for (auto instanceSyntax : syntax.instances)
                results.push_back(builder.create(*instanceSyntax));
        }
    };

    // If we came here from a bind directive we need to make use
    // of the definition / config info that has already been resolved.
    if (bindInfo) {
        auto defResult = comp.getDefinition(defName, *context.scope, syntax.type.range(),
                                            *bindInfo);
        if (defResult.configRoot) {
            SLANG_ASSERT(parentInst && parentInst->parentInstance);
            auto rc = comp.emplace<ResolvedConfig>(*defResult.configRoot,
                                                   *parentInst->parentInstance);
            resolvedConfig = rc;

            if (!bindInfo->isNewConfigRoot) {
                // This is not a new config root, so normally we'd use our parent's
                // config. For binds though we don't know the right parent scope
                // because it's the scope that contains the bind directive, not the
                // one that contains the instance, so recreate it here.
                defResult.configRoot = nullptr;
                rc->liblist = bindInfo->liblist;
            }
        }

        createInstances(defResult, nullptr);
        return;
    }

    if (resolvedConfig) {
        ResolvedInstanceRules instanceRules;
        resolveInstanceOverrides(*resolvedConfig, context, syntax, defName, diag::UnknownModule,
                                 instanceRules);
        if (!instanceRules.empty()) {
            for (auto& [defResult, instSyntax] : instanceRules)
                createInstances(defResult, instSyntax);
            return;
        }
    }

    // Simple case: look up the definition and create all instances in one go.
    auto defResult = comp.getDefinition(defName, *context.scope, syntax.type.range(),
                                        diag::UnknownModule);
    createInstances(defResult, nullptr);
}